

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_00;
  long lVar1;
  TxConfirmStats *pTVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TxConfirmStats *pTVar6;
  pointer pdVar7;
  mapped_type_conflict2 *pmVar8;
  runtime_error *prVar9;
  size_t in_RCX;
  int nFileVersion;
  int nFileVersion_00;
  int nFileVersion_01;
  vector<double,_std::allocator<double>_> *v;
  size_t numBuckets;
  ulong uVar10;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  TxConfirmStats *local_88;
  TxConfirmStats *local_80;
  uint32_t obj;
  int nVersionRequired;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  vector<double,_std::allocator<double>_> fileBuckets;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock7.super_unique_lock._M_device = &(this->m_cs_fee_estimator).super_mutex;
  criticalblock7.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock7.super_unique_lock);
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  nVersionRequired = obj;
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  if (0x46c6c < nVersionRequired) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>
              ((string *)&fileBuckets,"up-version (%d) fee estimate file",&nVersionRequired);
    std::runtime_error::runtime_error(prVar9,(string *)&fileBuckets);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0027953a;
  }
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  if (nVersionRequired < 0x2498c) {
    logging_function._M_str = "Read";
    logging_function._M_len = 4;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    LogPrintFormatInternal<char[5],int>
              (logging_function,source_file,0x3e9,ALL,Info,(ConstevalFormatString<2U>)0x7f2c98,
               (char (*) [5])"Read",&nVersionRequired);
  }
  else {
    uVar3 = obj;
    AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
    uVar4 = obj;
    AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
    uVar5 = obj;
    if ((obj < uVar4) || (uVar3 < obj)) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0027953a;
    }
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
    Unser<AutoFile,std::vector<double,std::allocator<double>>>
              ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)filein,
               (AutoFile *)&fileBuckets,v);
    numBuckets = (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
    if (numBuckets - 0x3e9 < 0xfffffffffffffc19) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0027953a;
    }
    pTVar6 = (TxConfirmStats *)operator_new(0xb0);
    defaultBuckets = &this->buckets;
    this_00 = &this->bucketMap;
    TxConfirmStats::TxConfirmStats(pTVar6,defaultBuckets,this_00,0x18,0.9952,2);
    _obj = pTVar6;
    pTVar6 = (TxConfirmStats *)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats(pTVar6,defaultBuckets,this_00,0xc,0.962,1);
    local_80 = pTVar6;
    pTVar6 = (TxConfirmStats *)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats(pTVar6,defaultBuckets,this_00,0x2a,0.99931,0x18);
    local_88 = pTVar6;
    TxConfirmStats::Read(_obj,filein,nFileVersion,numBuckets);
    TxConfirmStats::Read(local_80,filein,nFileVersion_00,numBuckets);
    TxConfirmStats::Read(local_88,filein,nFileVersion_01,numBuckets);
    std::vector<double,_std::allocator<double>_>::operator=(defaultBuckets,&fileBuckets);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear(&this_00->_M_t);
    pdVar7 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      uVar10 = 0;
      do {
        pmVar8 = std::
                 map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                 ::operator[](this_00,pdVar7 + uVar10);
        *pmVar8 = (mapped_type_conflict2)uVar10;
        uVar10 = (ulong)((mapped_type_conflict2)uVar10 + 1);
        pdVar7 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(this->buckets).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
    }
    pTVar2 = _obj;
    _obj = (TxConfirmStats *)0x0;
    pTVar6 = (this->feeStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->feeStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar2;
    if (pTVar6 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->feeStats,pTVar6);
    }
    pTVar2 = local_80;
    local_80 = (TxConfirmStats *)0x0;
    pTVar6 = (this->shortStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->shortStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar2;
    if (pTVar6 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->shortStats,pTVar6);
    }
    pTVar2 = local_88;
    local_88 = (TxConfirmStats *)0x0;
    pTVar6 = (this->longStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->longStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar2;
    if (pTVar6 == (TxConfirmStats *)0x0) {
      this->nBestSeenHeight = uVar3;
      this->historicalFirst = uVar4;
      this->historicalBest = uVar5;
    }
    else {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->longStats,pTVar6);
      this->nBestSeenHeight = uVar3;
      this->historicalFirst = uVar4;
      this->historicalBest = uVar5;
      if (local_88 != (TxConfirmStats *)0x0) {
        std::default_delete<TxConfirmStats>::operator()
                  ((default_delete<TxConfirmStats> *)&local_88,local_88);
      }
    }
    if (local_80 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&local_80,local_80);
    }
    if (_obj != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()((default_delete<TxConfirmStats> *)&obj,_obj);
    }
    if (fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
LAB_0027953a:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}